

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_synaptic_impairment(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    txt = "They are already affected by synaptic impairment.\n\r";
  }
  else {
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,0xc);
    if (!bVar1) {
      bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_synaptic_enhancement);
      if (bVar1) {
        send_to_char("Your mind clouds slightly as your synaptic enhancement wears off.\n\r",
                     (CHAR_DATA *)vo);
        act("$n appears to be thinking normally again.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        switchD_002e4026::default((CHAR_DATA *)vo,(int)gsn_synaptic_enhancement);
        return;
      }
      init_affect(&local_90);
      local_90.where = 0;
      local_90.aftype = get_spell_aftype(ch);
      local_90.type = (short)sn;
      local_90.location = 0;
      local_90.modifier = 0;
      local_90.duration =
           (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f);
      local_90.mod_name = 7;
      local_90.level = (short)level;
      affect_to_char((CHAR_DATA *)vo,&local_90);
      act("You disrupt $N\'s ability to focus with a controlled electrical burst!",ch,(void *)0x0,vo
          ,3);
      act("$n disrupts $N\'s ability to focus with a controlled electrical burst!",ch,(void *)0x0,vo
          ,1);
      act("Your mind clouds and you find concentration somewhat more difficult.",ch,(void *)0x0,vo,2
         );
      return;
    }
    txt = "You failed.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_synaptic_impairment(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("They are already affected by synaptic impairment.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_MENTAL))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_synaptic_enhancement))
	{
		send_to_char("Your mind clouds slightly as your synaptic enhancement wears off.\n\r", victim);
		act("$n appears to be thinking normally again.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, gsn_synaptic_enhancement);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 5;
	af.mod_name = MOD_CONC;
	affect_to_char(victim, &af);

	act("You disrupt $N's ability to focus with a controlled electrical burst!", ch, 0, victim, TO_CHAR);
	act("$n disrupts $N's ability to focus with a controlled electrical burst!", ch, 0, victim, TO_NOTVICT);
	act("Your mind clouds and you find concentration somewhat more difficult.", ch, 0, victim, TO_VICT);
}